

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O2

Var Js::RegexHelper::StringReplace
              (ScriptContext *scriptContext,JavascriptString *match,JavascriptString *input,
              RecyclableObject *replacefn)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  Attributes attributes;
  charcount_t cVar5;
  charcount_t cVar6;
  charcount_t cVar7;
  char *pcVar8;
  undefined4 *puVar9;
  RecyclableObject *ptr;
  JavascriptString *pJVar10;
  char16 *prefix;
  char16 *content;
  charcount_t cchPrefix;
  BufferStringBuilder local_80;
  BufferStringBuilder bufferString;
  
  pcVar8 = JavascriptString::strstr((char *)input,(char *)match);
  if ((((((match->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
      super_JavascriptLibraryBase).scriptContext.ptr != scriptContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x5d1,"(match->GetScriptContext() == scriptContext)",
                                "match->GetScriptContext() == scriptContext");
    if (!bVar3) goto LAB_00bdff98;
    *puVar9 = 0;
  }
  if ((((((input->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
      super_JavascriptLibraryBase).scriptContext.ptr != scriptContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x5d2,"(input->GetScriptContext() == scriptContext)",
                                "input->GetScriptContext() == scriptContext");
    if (!bVar3) {
LAB_00bdff98:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
  }
  cchPrefix = (charcount_t)pcVar8;
  if (cchPrefix == 0xffffffff) {
    return input;
  }
  this = scriptContext->threadContext;
  bVar3 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  local_80.m_string = (WritableString *)scriptContext;
  bufferString.m_string = (WritableString *)this;
  attributes = FunctionInfo::GetAttributes(replacefn);
  bVar4 = ThreadContext::HasNoSideEffect(this,replacefn,attributes);
  if (bVar4) {
    ptr = (RecyclableObject *)
          StringReplace::anon_class_48_6_667bc279::operator()
                    ((anon_class_48_6_667bc279 *)&stack0xffffffffffffff80);
    bVar4 = ThreadContext::IsOnStack(ptr);
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      ptr = (((((((((replacefn->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
            super_JavascriptLibraryBase).undefinedValue.ptr;
      goto LAB_00bdfeac;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this->implicitCallFlags;
      ptr = (RecyclableObject *)
            StringReplace::anon_class_48_6_667bc279::operator()
                      ((anon_class_48_6_667bc279 *)&stack0xffffffffffffff80);
      this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00bdfeac;
    }
    ptr = (RecyclableObject *)
          StringReplace::anon_class_48_6_667bc279::operator()
                    ((anon_class_48_6_667bc279 *)&stack0xffffffffffffff80);
    bVar4 = ThreadContext::IsOnStack(ptr);
  }
  if (bVar4 != false) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00bdfeac:
  this->reentrancySafeOrHandled = bVar3;
  pJVar10 = JavascriptConversion::ToString(ptr,scriptContext);
  prefix = JavascriptString::GetString(input);
  cVar5 = JavascriptString::GetLength(match);
  cVar6 = JavascriptString::GetLength(input);
  cVar7 = JavascriptString::GetLength(match);
  cVar6 = cVar6 - (cVar7 + cchPrefix);
  cVar7 = JavascriptString::GetLength(pJVar10);
  local_80.m_string =
       BufferStringBuilder::WritableString::New
                 (cchPrefix + cVar6 + cVar7,
                  (((((match->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                  super_JavascriptLibraryBase).scriptContext.ptr);
  content = JavascriptString::GetString(pJVar10);
  cVar7 = JavascriptString::GetLength(pJVar10);
  BufferStringBuilder::SetContent
            (&stack0xffffffffffffff80,prefix,cchPrefix,content,cVar7,
             prefix + ((ulong)pcVar8 & 0xffffffff) + (ulong)cVar5,cVar6);
  pJVar10 = BufferStringBuilder::ToString(&stack0xffffffffffffff80);
  return pJVar10;
}

Assistant:

Var RegexHelper::StringReplace(ScriptContext* scriptContext, JavascriptString* match, JavascriptString* input, RecyclableObject* replacefn)
    {
        CharCount indexMatched = JavascriptString::strstr(input, match, true);
        Assert(match->GetScriptContext() == scriptContext);
        Assert(input->GetScriptContext() == scriptContext);

        if (indexMatched != CharCountFlag)
        {
            ThreadContext* threadContext = scriptContext->GetThreadContext();
            Var replaceVar = threadContext->ExecuteImplicitCall(replacefn, ImplicitCall_Accessor, [=]()->Js::Var
            {
                Var pThis = scriptContext->GetLibrary()->GetUndefined();
                return CALL_FUNCTION(threadContext, replacefn, CallInfo(4), pThis, match, JavascriptNumber::ToVar((int)indexMatched, scriptContext), input);
            });
            JavascriptString* replace = JavascriptConversion::ToString(replaceVar, scriptContext);
            const char16* inputStr = input->GetString();
            const char16* prefixStr = inputStr;
            CharCount prefixLength = indexMatched;
            const char16* postfixStr = inputStr + prefixLength + match->GetLength();
            CharCount postfixLength = input->GetLength() - prefixLength - match->GetLength();
            CharCount newLength = prefixLength + postfixLength + replace->GetLength();
            BufferStringBuilder bufferString(newLength, match->GetScriptContext());
            bufferString.SetContent(prefixStr, prefixLength,
                replace->GetString(), replace->GetLength(),
                postfixStr, postfixLength);
            return bufferString.ToString();
        }

        return input;
    }